

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

TypeID NULLCTypeInfo::GetFunctionContextType(NULLCRef obj)

{
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  ExternFuncInfo *pEVar3;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  uint local_2c;
  ExternFuncInfo *function;
  ExternTypeInfo *type;
  
  if (linker != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000008);
    if (pEVar1->subCat == CAT_FUNCTION) {
      pEVar3 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                         ((FastVector<ExternFuncInfo,_false,_false> *)(linker + 0x240),
                          *(uint *)(CONCAT124(obj,in_stack_0000000c) + 8));
      if (pEVar3->contextType == 0xffffffff) {
        local_2c = 0;
      }
      else {
        local_2c = pEVar3->contextType;
      }
      type._4_4_ = getTypeID(local_2c);
    }
    else {
      pcVar2 = FastVector<char,_false,_false>::operator[]
                         ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName);
      nullcThrowError("functionGetContextType: received type \'%s\' that is not a function",pcVar2);
      type._4_4_ = getTypeID(0);
    }
    return (TypeID)type._4_4_;
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0x14d,"TypeID NULLCTypeInfo::GetFunctionContextType(NULLCRef)");
}

Assistant:

TypeID GetFunctionContextType(NULLCRef obj)
	{
		assert(linker);

		ExternTypeInfo &type = linker->exTypes[obj.typeID];

		if(type.subCat != ExternTypeInfo::CAT_FUNCTION)
		{
			nullcThrowError("functionGetContextType: received type '%s' that is not a function", &linker->exSymbols[type.offsetToName]);
			return getTypeID(0);
		}

		ExternFuncInfo &function = linker->exFunctions[*(int*)(obj.ptr + NULLC_PTR_SIZE)];
		return getTypeID(function.contextType != ~0u ? function.contextType : 0);
	}